

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  parasail_result_t *ppVar25;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  __m128i *ptr_06;
  __m128i *palVar26;
  uint uVar27;
  uint uVar28;
  char *pcVar29;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  undefined2 uVar33;
  char *__format;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  long lVar37;
  __m128i *palVar38;
  long lVar39;
  long lVar40;
  uint uVar41;
  ulong uVar42;
  int32_t t;
  bool bVar43;
  short sVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 extraout_XMM0 [16];
  __m128i alVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i alVar61;
  undefined1 auVar62 [16];
  undefined1 auVar83 [16];
  __m128i alVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  __m128i alVar87;
  undefined1 auVar88 [16];
  ushort uVar89;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  undefined1 auVar90 [16];
  __m128i alVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  ushort uVar103;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  __m128i alVar96;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  __m128i alVar106;
  ulong uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  ushort uVar114;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  undefined1 auVar115 [16];
  ushort uVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  short sVar125;
  ushort uVar126;
  short sVar130;
  short sVar132;
  short sVar134;
  short sVar136;
  short sVar138;
  short sVar140;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  ushort uVar131;
  ushort uVar133;
  ushort uVar135;
  ushort uVar137;
  ushort uVar139;
  ushort uVar141;
  short sVar142;
  ushort uVar143;
  undefined1 auVar129 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i vH;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  int32_t in_stack_fffffffffffffce8;
  int local_314;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  short local_1c8;
  short sStack_1c6;
  undefined1 local_1b8 [16];
  short local_1a8;
  short sStack_1a6;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178 [16];
  short local_108;
  short sStack_106;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  __m128i_16_t h;
  size_t len;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar29 = "profile";
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar29 = "profile->profile16.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar29 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar29 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar29 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar29 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar29 = "open";
        }
        else {
          if (-1 < gap) {
            uVar31 = uVar3 - 1;
            uVar42 = (ulong)uVar3 + 7 >> 3;
            uVar50 = (ulong)uVar31 % uVar42;
            iVar35 = -open;
            iVar21 = ppVar5->min;
            iVar24 = -iVar21;
            if (iVar21 != iVar35 && SBORROW4(iVar21,iVar35) == iVar21 + open < 0) {
              iVar24 = open;
            }
            pvVar6 = (profile->profile16).matches;
            uVar28 = (uint)CONCAT62((int6)((ulong)pvVar6 >> 0x10),0x7ffe - (short)ppVar5->max);
            local_248._0_4_ = uVar28;
            pvVar7 = (profile->profile16).similar;
            ppVar25 = parasail_result_new_table3((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
            if (ppVar25 != (parasail_result_t *)0x0) {
              local_268._0_4_ = open;
              local_258._0_4_ = (int)uVar50;
              ppVar25->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar25->flag | 0x8230402;
              b = parasail_memalign___m128i(0x10,uVar42);
              b_00 = parasail_memalign___m128i(0x10,uVar42);
              b_01 = parasail_memalign___m128i(0x10,uVar42);
              b_02 = parasail_memalign___m128i(0x10,uVar42);
              ptr = parasail_memalign___m128i(0x10,uVar42);
              b_03 = parasail_memalign___m128i(0x10,uVar42);
              b_04 = parasail_memalign___m128i(0x10,uVar42);
              b_05 = parasail_memalign___m128i(0x10,uVar42);
              ptr_00 = parasail_memalign___m128i(0x10,uVar42);
              ptr_01 = parasail_memalign___m128i(0x10,uVar42);
              ptr_02 = parasail_memalign___m128i(0x10,uVar42);
              ptr_03 = parasail_memalign___m128i(0x10,uVar42);
              ptr_04 = parasail_memalign___m128i(0x10,uVar42);
              ptr_05 = parasail_memalign___m128i(0x10,uVar42);
              ptr_06 = (__m128i *)parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              auVar51._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar51._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar52._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
              auVar52._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
              auVar51 = packssdw(auVar51,auVar52);
              auVar83._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar83._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
              auVar90._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
              auVar90._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
              auVar83 = packssdw(auVar83,auVar90);
              auVar51 = packssdw(auVar51,auVar83);
              if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                    ptr_05 != (__m128i *)0x0) &&
                   ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                   ptr_02 != (__m128i *)0x0)) && ptr_06 != (__m128i *)0x0) &&
                  ((((((((((((((((auVar51 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar51 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar51 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar51 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar51 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar51 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar51 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar51 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar51 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar51 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar51 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar51 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar51 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar51 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar51[0xf])) {
                iVar21 = s2Len + -1;
                uVar27 = 7 - (int)(uVar31 / uVar42);
                len = (size_t)uVar27;
                auVar51 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar48 = auVar51._0_4_;
                auVar51 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar49 = auVar51._0_4_;
                uVar22 = iVar24 - 0x7fff;
                auVar51 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
                local_1c8 = auVar51._0_2_;
                sStack_1c6 = auVar51._2_2_;
                auVar83 = pshuflw(ZEXT416(uVar28),ZEXT416(uVar28),0);
                local_108 = auVar83._0_2_;
                sStack_106 = auVar83._2_2_;
                auVar52 = pshuflw(ZEXT416(uVar27),ZEXT416(uVar27),0);
                local_1a8 = auVar52._0_2_;
                sStack_1a6 = auVar52._2_2_;
                uVar41 = (uint)uVar42;
                auVar52 = pshufb(ZEXT416(uVar41),_DAT_008a3bd0);
                auVar90 = pshufb(ZEXT416(-(uVar41 * gap)),_DAT_008a3bd0);
                auVar90 = paddsw(auVar90,ZEXT416(uVar22 & 0xffff));
                alVar84[1]._0_4_ = gap;
                alVar84[0] = uVar42;
                alVar84[1]._4_4_ = 0;
                parasail_memset___m128i(b_03,alVar84,len);
                alVar53[1] = extraout_RDX;
                alVar53[0] = uVar42;
                parasail_memset___m128i(b_04,alVar53,len);
                alVar91[1] = extraout_RDX_00;
                alVar91[0] = uVar42;
                parasail_memset___m128i(b_05,alVar91,len);
                c[1] = extraout_RDX_01;
                c[0] = uVar42;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_02;
                c_00[0] = uVar42;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_03;
                c_01[0] = uVar42;
                parasail_memset___m128i(b_01,c_01,len);
                c_02[1] = extraout_RDX_04;
                c_02[0] = uVar42;
                parasail_memset___m128i(b_02,c_02,len);
                auVar104._4_4_ = uVar48;
                auVar104._0_4_ = uVar48;
                auVar104._8_4_ = uVar48;
                auVar104._12_4_ = uVar48;
                alVar91 = (__m128i)psubsw((undefined1  [16])0x0,auVar104);
                uVar23 = uVar41 - 1;
                alVar53 = (__m128i)pmovsxbw(extraout_XMM0,0x101010101010101);
                alVar84 = alVar53;
                for (uVar28 = uVar23; -1 < (int)uVar28; uVar28 = uVar28 - 1) {
                  ptr_04[uVar28] = alVar91;
                  ptr_05[uVar28] = alVar84;
                  auVar108._4_4_ = uVar49;
                  auVar108._0_4_ = uVar49;
                  auVar108._8_4_ = uVar49;
                  auVar108._12_4_ = uVar49;
                  alVar91 = (__m128i)psubsw((undefined1  [16])alVar91,auVar108);
                  alVar84 = (__m128i)paddsw((undefined1  [16])alVar84,(undefined1  [16])alVar53);
                }
                lVar30 = (long)iVar35;
                for (uVar34 = 0; uVar34 != uVar42; uVar34 = uVar34 + 1) {
                  lVar37 = lVar30;
                  for (lVar39 = 0; lVar39 != 8; lVar39 = lVar39 + 1) {
                    lVar40 = lVar37;
                    if (s1_beg != 0) {
                      lVar40 = 0;
                    }
                    if (lVar40 < -0x7fff) {
                      lVar40 = -0x8000;
                    }
                    *(short *)((long)&h + lVar39 * 2) = (short)lVar40;
                    lVar37 = lVar37 - uVar42 * (uint)gap;
                  }
                  ptr[uVar34][0] = h.m[0];
                  ptr[uVar34][1] = h.m[1];
                  lVar30 = lVar30 - (ulong)(uint)gap;
                }
                *(undefined2 *)*ptr_06 = 0;
                for (uVar34 = 1; s2Len + 1 != uVar34; uVar34 = uVar34 + 1) {
                  uVar33 = 0x8000;
                  if (-0x8000 < iVar35) {
                    uVar33 = (undefined2)iVar35;
                  }
                  if (s2_beg != 0) {
                    uVar33 = 0;
                  }
                  *(undefined2 *)((long)*ptr_06 + uVar34 * 2) = uVar33;
                  iVar35 = iVar35 - gap;
                }
                palVar26 = ptr + uVar50;
                local_188 = CONCAT26(sStack_106,CONCAT24(local_108,auVar83._0_4_));
                uStack_180 = CONCAT26(sStack_106,CONCAT24(local_108,auVar83._0_4_));
                auVar95._4_2_ = local_1c8;
                auVar95._0_4_ = auVar51._0_4_;
                auVar95._6_2_ = sStack_1c6;
                auVar95._8_2_ = local_1c8;
                auVar95._10_2_ = sStack_1c6;
                auVar95._12_2_ = local_1c8;
                auVar95._14_2_ = sStack_1c6;
                palVar38 = ptr_06;
                uVar34 = 0;
                auVar105 = auVar95;
                auVar109 = auVar95;
                auVar111 = auVar95;
                local_314 = iVar21;
                local_178 = auVar95;
                while (uVar34 != (uint)s2Len) {
                  uVar107 = ptr[uVar23][0];
                  uVar32 = b_03[uVar23][0];
                  uVar13 = b_04[uVar23][0];
                  uVar14 = b_05[uVar23][0];
                  auVar112._0_8_ = uVar32 << 0x10;
                  auVar112._8_8_ = b_03[uVar23][1] << 0x10 | uVar32 >> 0x30;
                  auVar115._0_8_ = uVar13 << 0x10;
                  auVar115._8_8_ = b_04[uVar23][1] << 0x10 | uVar13 >> 0x30;
                  auVar123._0_8_ = uVar14 << 0x10;
                  auVar123._8_8_ = b_05[uVar23][1] << 0x10 | uVar14 >> 0x30;
                  auVar85._8_8_ = ptr[uVar23][1] << 0x10 | uVar107 >> 0x30;
                  auVar85._0_8_ = uVar107 << 0x10 | (ulong)*(ushort *)((long)*ptr_06 + uVar34 * 2);
                  lVar30 = (long)(int)(ppVar5->mapper[(byte)s2[uVar34]] * uVar41) * 0x10;
                  auVar124._4_2_ = local_1c8;
                  auVar124._0_4_ = auVar51._0_4_;
                  auVar124._6_2_ = sStack_1c6;
                  auVar124._8_2_ = local_1c8;
                  auVar124._10_2_ = sStack_1c6;
                  auVar124._12_2_ = local_1c8;
                  auVar124._14_2_ = sStack_1c6;
                  auVar127 = psubsw(auVar124,(undefined1  [16])*ptr_04);
                  local_298 = ZEXT816(0);
                  lVar37 = 0;
                  local_2b8 = ZEXT816(0);
                  local_2a8 = ZEXT816(0);
                  while( true ) {
                    sVar47 = auVar124._2_2_;
                    sVar67 = auVar124._4_2_;
                    sVar70 = auVar124._6_2_;
                    sVar73 = auVar124._8_2_;
                    sVar76 = auVar124._10_2_;
                    sVar79 = auVar124._12_2_;
                    sVar82 = auVar124._14_2_;
                    sVar46 = auVar124._0_2_;
                    if (uVar42 << 4 == lVar37) break;
                    auVar83 = *(undefined1 (*) [16])((long)*ptr + lVar37);
                    auVar104 = *(undefined1 (*) [16])((long)*b_03 + lVar37);
                    auVar108 = *(undefined1 (*) [16])((long)*b_04 + lVar37);
                    auVar16._4_4_ = uVar48;
                    auVar16._0_4_ = uVar48;
                    auVar16._8_4_ = uVar48;
                    auVar16._12_4_ = uVar48;
                    auVar124 = psubsw(auVar83,auVar16);
                    auVar18._4_4_ = uVar49;
                    auVar18._0_4_ = uVar49;
                    auVar18._8_4_ = uVar49;
                    auVar18._12_4_ = uVar49;
                    auVar128 = psubsw(*(undefined1 (*) [16])((long)*b + lVar37),auVar18);
                    sVar44 = auVar124._0_2_;
                    sVar125 = auVar128._0_2_;
                    auVar54._0_2_ = -(ushort)(sVar125 < sVar44);
                    sVar63 = auVar124._2_2_;
                    sVar130 = auVar128._2_2_;
                    auVar54._2_2_ = -(ushort)(sVar130 < sVar63);
                    sVar65 = auVar124._4_2_;
                    sVar132 = auVar128._4_2_;
                    auVar54._4_2_ = -(ushort)(sVar132 < sVar65);
                    sVar68 = auVar124._6_2_;
                    sVar134 = auVar128._6_2_;
                    auVar54._6_2_ = -(ushort)(sVar134 < sVar68);
                    sVar71 = auVar124._8_2_;
                    sVar136 = auVar128._8_2_;
                    auVar54._8_2_ = -(ushort)(sVar136 < sVar71);
                    sVar74 = auVar124._10_2_;
                    sVar138 = auVar128._10_2_;
                    auVar54._10_2_ = -(ushort)(sVar138 < sVar74);
                    sVar77 = auVar124._12_2_;
                    sVar140 = auVar128._12_2_;
                    sVar80 = auVar124._14_2_;
                    auVar54._12_2_ = -(ushort)(sVar140 < sVar77);
                    sVar142 = auVar128._14_2_;
                    auVar54._14_2_ = -(ushort)(sVar142 < sVar80);
                    auVar144 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar37),auVar104,
                                        auVar54);
                    auVar145 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar37),auVar108,
                                        auVar54);
                    auVar128 = *(undefined1 (*) [16])((long)*b_05 + lVar37);
                    auVar124 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar37),auVar128,
                                        auVar54);
                    auVar127 = paddsw(auVar127,*(undefined1 (*) [16])((long)*ptr_04 + lVar37));
                    sVar45 = auVar127._0_2_;
                    auVar55._0_2_ = -(ushort)(sVar46 < sVar45);
                    sVar64 = auVar127._2_2_;
                    auVar55._2_2_ = -(ushort)(sVar47 < sVar64);
                    sVar66 = auVar127._4_2_;
                    auVar55._4_2_ = -(ushort)(sVar67 < sVar66);
                    sVar69 = auVar127._6_2_;
                    auVar55._6_2_ = -(ushort)(sVar70 < sVar69);
                    sVar72 = auVar127._8_2_;
                    auVar55._8_2_ = -(ushort)(sVar73 < sVar72);
                    sVar75 = auVar127._10_2_;
                    auVar55._10_2_ = -(ushort)(sVar76 < sVar75);
                    sVar78 = auVar127._12_2_;
                    sVar81 = auVar127._14_2_;
                    auVar55._12_2_ = -(ushort)(sVar79 < sVar78);
                    auVar55._14_2_ = -(ushort)(sVar82 < sVar81);
                    local_298 = pblendvb(local_298,local_248,auVar55);
                    local_2b8 = pblendvb(local_2b8,local_258,auVar55);
                    uVar126 = (ushort)(sVar125 < sVar44) * sVar44 |
                              (ushort)(sVar125 >= sVar44) * sVar125;
                    uVar131 = (ushort)(sVar130 < sVar63) * sVar63 |
                              (ushort)(sVar130 >= sVar63) * sVar130;
                    uVar133 = (ushort)(sVar132 < sVar65) * sVar65 |
                              (ushort)(sVar132 >= sVar65) * sVar132;
                    uVar135 = (ushort)(sVar134 < sVar68) * sVar68 |
                              (ushort)(sVar134 >= sVar68) * sVar134;
                    uVar137 = (ushort)(sVar136 < sVar71) * sVar71 |
                              (ushort)(sVar136 >= sVar71) * sVar136;
                    uVar139 = (ushort)(sVar138 < sVar74) * sVar74 |
                              (ushort)(sVar138 >= sVar74) * sVar138;
                    uVar141 = (ushort)(sVar140 < sVar77) * sVar77 |
                              (ushort)(sVar140 >= sVar77) * sVar140;
                    uVar143 = (ushort)(sVar142 < sVar80) * sVar80 |
                              (ushort)(sVar142 >= sVar80) * sVar142;
                    auVar127 = paddsw(local_268,*(undefined1 (*) [16])((long)*ptr_05 + lVar37));
                    local_2a8 = pblendvb(local_2a8,auVar127,auVar55);
                    auVar110 = paddsw(auVar85,*(undefined1 (*) [16])((long)pvVar4 + lVar37 + lVar30)
                                     );
                    auVar112 = paddsw(auVar112,*(undefined1 (*) [16])
                                                ((long)pvVar6 + lVar37 + lVar30));
                    auVar115 = paddsw(auVar115,*(undefined1 (*) [16])
                                                ((long)pvVar7 + lVar37 + lVar30));
                    sVar44 = auVar110._0_2_;
                    auVar56._0_2_ = -(ushort)(sVar44 < (short)uVar126);
                    sVar63 = auVar110._2_2_;
                    auVar56._2_2_ = -(ushort)(sVar63 < (short)uVar131);
                    sVar65 = auVar110._4_2_;
                    auVar56._4_2_ = -(ushort)(sVar65 < (short)uVar133);
                    sVar68 = auVar110._6_2_;
                    auVar56._6_2_ = -(ushort)(sVar68 < (short)uVar135);
                    sVar71 = auVar110._8_2_;
                    auVar56._8_2_ = -(ushort)(sVar71 < (short)uVar137);
                    sVar74 = auVar110._10_2_;
                    auVar56._10_2_ = -(ushort)(sVar74 < (short)uVar139);
                    sVar77 = auVar110._12_2_;
                    auVar56._12_2_ = -(ushort)(sVar77 < (short)uVar141);
                    sVar80 = auVar110._14_2_;
                    auVar56._14_2_ = -(ushort)(sVar80 < (short)uVar143);
                    local_248 = pblendvb(auVar112,auVar144,auVar56);
                    local_258 = pblendvb(auVar115,auVar145,auVar56);
                    auVar127 = pmovsxbw(local_258,0x101010101010101);
                    auVar85 = paddsw(auVar124,auVar127);
                    auVar123 = paddsw(auVar123,auVar127);
                    local_268 = pblendvb(auVar123,auVar85,auVar56);
                    auVar124._0_2_ =
                         (ushort)(sVar46 < sVar45) * sVar45 | (ushort)(sVar46 >= sVar45) * sVar46;
                    auVar124._2_2_ =
                         (ushort)(sVar47 < sVar64) * sVar64 | (ushort)(sVar47 >= sVar64) * sVar47;
                    auVar124._4_2_ =
                         (ushort)(sVar67 < sVar66) * sVar66 | (ushort)(sVar67 >= sVar66) * sVar67;
                    auVar124._6_2_ =
                         (ushort)(sVar70 < sVar69) * sVar69 | (ushort)(sVar70 >= sVar69) * sVar70;
                    auVar124._8_2_ =
                         (ushort)(sVar73 < sVar72) * sVar72 | (ushort)(sVar73 >= sVar72) * sVar73;
                    auVar124._10_2_ =
                         (ushort)(sVar76 < sVar75) * sVar75 | (ushort)(sVar76 >= sVar75) * sVar76;
                    auVar124._12_2_ =
                         (ushort)(sVar79 < sVar78) * sVar78 | (ushort)(sVar79 >= sVar78) * sVar79;
                    auVar124._14_2_ =
                         (ushort)(sVar82 < sVar81) * sVar81 | (ushort)(sVar82 >= sVar81) * sVar82;
                    puVar1 = (ushort *)((long)*b + lVar37);
                    *puVar1 = uVar126;
                    puVar1[1] = uVar131;
                    puVar1[2] = uVar133;
                    puVar1[3] = uVar135;
                    puVar1[4] = uVar137;
                    puVar1[5] = uVar139;
                    puVar1[6] = uVar141;
                    puVar1[7] = uVar143;
                    *(undefined1 (*) [16])((long)*b_00 + lVar37) = auVar144;
                    *(undefined1 (*) [16])((long)*b_01 + lVar37) = auVar145;
                    *(undefined1 (*) [16])((long)*b_02 + lVar37) = auVar85;
                    auVar127._0_2_ =
                         (ushort)((short)uVar126 < sVar44) * sVar44 |
                         ((short)uVar126 >= sVar44) * uVar126;
                    auVar127._2_2_ =
                         (ushort)((short)uVar131 < sVar63) * sVar63 |
                         ((short)uVar131 >= sVar63) * uVar131;
                    auVar127._4_2_ =
                         (ushort)((short)uVar133 < sVar65) * sVar65 |
                         ((short)uVar133 >= sVar65) * uVar133;
                    auVar127._6_2_ =
                         (ushort)((short)uVar135 < sVar68) * sVar68 |
                         ((short)uVar135 >= sVar68) * uVar135;
                    auVar127._8_2_ =
                         (ushort)((short)uVar137 < sVar71) * sVar71 |
                         ((short)uVar137 >= sVar71) * uVar137;
                    auVar127._10_2_ =
                         (ushort)((short)uVar139 < sVar74) * sVar74 |
                         ((short)uVar139 >= sVar74) * uVar139;
                    auVar127._12_2_ =
                         (ushort)((short)uVar141 < sVar77) * sVar77 |
                         ((short)uVar141 >= sVar77) * uVar141;
                    auVar127._14_2_ =
                         (ushort)((short)uVar143 < sVar80) * sVar80 |
                         ((short)uVar143 >= sVar80) * uVar143;
                    *(undefined1 (*) [16])((long)*ptr + lVar37) = auVar110;
                    *(undefined1 (*) [16])((long)*b_03 + lVar37) = auVar112;
                    *(undefined1 (*) [16])((long)*b_04 + lVar37) = auVar115;
                    *(undefined1 (*) [16])((long)*b_05 + lVar37) = auVar123;
                    lVar37 = lVar37 + 0x10;
                    palVar38 = ptr;
                    auVar85 = auVar83;
                    auVar112 = auVar104;
                    auVar115 = auVar108;
                    auVar123 = auVar128;
                  }
                  auVar110._0_8_ = local_248._0_8_ << 0x10;
                  auVar110._8_8_ = local_248._8_8_ << 0x10 | (ulong)local_248._0_8_ >> 0x30;
                  auVar144._0_8_ = local_258._0_8_ << 0x10;
                  auVar144._8_8_ = local_258._8_8_ << 0x10 | (ulong)local_258._0_8_ >> 0x30;
                  auVar113._0_8_ = local_268._0_8_ << 0x10;
                  auVar113._8_8_ = local_268._8_8_ << 0x10 | (ulong)local_268._0_8_ >> 0x30;
                  auVar129._8_8_ = auVar127._8_8_ << 0x10 | auVar127._0_8_ >> 0x30;
                  uVar107 = uVar34 + 1;
                  uVar126 = *(ushort *)((long)*ptr_06 + uVar34 * 2 + 2);
                  auVar129._0_8_ = auVar127._0_8_ << 0x10 | (ulong)uVar126;
                  auVar83 = paddsw((undefined1  [16])*ptr_04,auVar129);
                  sVar44 = auVar83._0_2_;
                  auVar128._0_2_ = -(ushort)(sVar44 < sVar46);
                  sVar45 = auVar83._2_2_;
                  auVar128._2_2_ = -(ushort)(sVar45 < sVar47);
                  sVar63 = auVar83._4_2_;
                  auVar128._4_2_ = -(ushort)(sVar63 < sVar67);
                  sVar64 = auVar83._6_2_;
                  auVar128._6_2_ = -(ushort)(sVar64 < sVar70);
                  sVar65 = auVar83._8_2_;
                  auVar128._8_2_ = -(ushort)(sVar65 < sVar73);
                  sVar66 = auVar83._10_2_;
                  auVar128._10_2_ = -(ushort)(sVar66 < sVar76);
                  sVar68 = auVar83._12_2_;
                  auVar128._12_2_ = -(ushort)(sVar68 < sVar79);
                  sVar69 = auVar83._14_2_;
                  auVar128._14_2_ = -(ushort)(sVar69 < sVar82);
                  auVar145._0_2_ =
                       (ushort)(sVar44 < sVar46) * sVar46 | (ushort)(sVar44 >= sVar46) * sVar44;
                  auVar145._2_2_ =
                       (ushort)(sVar45 < sVar47) * sVar47 | (ushort)(sVar45 >= sVar47) * sVar45;
                  auVar145._4_2_ =
                       (ushort)(sVar63 < sVar67) * sVar67 | (ushort)(sVar63 >= sVar67) * sVar63;
                  auVar145._6_2_ =
                       (ushort)(sVar64 < sVar70) * sVar70 | (ushort)(sVar64 >= sVar70) * sVar64;
                  auVar145._8_2_ =
                       (ushort)(sVar65 < sVar73) * sVar73 | (ushort)(sVar65 >= sVar73) * sVar65;
                  auVar145._10_2_ =
                       (ushort)(sVar66 < sVar76) * sVar76 | (ushort)(sVar66 >= sVar76) * sVar66;
                  auVar145._12_2_ =
                       (ushort)(sVar68 < sVar79) * sVar79 | (ushort)(sVar68 >= sVar79) * sVar68;
                  auVar145._14_2_ =
                       (ushort)(sVar69 < sVar82) * sVar82 | (ushort)(sVar69 >= sVar82) * sVar69;
                  auVar83 = pblendvb(auVar110,local_298,auVar128);
                  auVar108 = pblendvb(auVar144,local_2b8,auVar128);
                  auVar104 = paddsw((undefined1  [16])*ptr_05,auVar113);
                  auVar104 = pblendvb(auVar104,local_2a8,auVar128);
                  iVar24 = 6;
                  while( true ) {
                    auVar92._0_8_ = auVar145._0_8_ << 0x10;
                    auVar92._8_8_ = auVar145._8_8_ << 0x10 | auVar145._0_8_ >> 0x30;
                    local_d8._0_8_ = auVar83._0_8_ << 0x10;
                    local_d8._8_8_ = auVar83._8_8_ << 0x10 | auVar83._0_8_ >> 0x30;
                    local_e8._0_8_ = auVar108._0_8_ << 0x10;
                    local_e8._8_8_ = auVar108._8_8_ << 0x10 | auVar108._0_8_ >> 0x30;
                    local_f8._0_8_ = auVar104._0_8_ << 0x10;
                    local_f8._8_8_ = auVar104._8_8_ << 0x10 | auVar104._0_8_ >> 0x30;
                    bVar43 = iVar24 == 0;
                    iVar24 = iVar24 + -1;
                    if (bVar43) break;
                    auVar124 = paddsw(auVar92,auVar90);
                    sVar46 = auVar145._0_2_;
                    sVar44 = auVar124._0_2_;
                    auVar57._0_2_ = -(ushort)(sVar44 < sVar46);
                    sVar47 = auVar145._2_2_;
                    sVar45 = auVar124._2_2_;
                    auVar57._2_2_ = -(ushort)(sVar45 < sVar47);
                    sVar67 = auVar145._4_2_;
                    sVar63 = auVar124._4_2_;
                    auVar57._4_2_ = -(ushort)(sVar63 < sVar67);
                    sVar70 = auVar145._6_2_;
                    sVar64 = auVar124._6_2_;
                    auVar57._6_2_ = -(ushort)(sVar64 < sVar70);
                    sVar73 = auVar145._8_2_;
                    sVar65 = auVar124._8_2_;
                    auVar57._8_2_ = -(ushort)(sVar65 < sVar73);
                    sVar76 = auVar145._10_2_;
                    sVar66 = auVar124._10_2_;
                    auVar57._10_2_ = -(ushort)(sVar66 < sVar76);
                    sVar79 = auVar145._12_2_;
                    sVar68 = auVar124._12_2_;
                    sVar82 = auVar145._14_2_;
                    auVar57._12_2_ = -(ushort)(sVar68 < sVar79);
                    sVar69 = auVar124._14_2_;
                    auVar57._14_2_ = -(ushort)(sVar69 < sVar82);
                    auVar83 = pblendvb(local_d8,auVar83,auVar57);
                    auVar108 = pblendvb(local_e8,auVar108,auVar57);
                    auVar124 = paddsw(local_f8,auVar52);
                    auVar104 = pblendvb(auVar124,auVar104,auVar57);
                    auVar145._0_2_ =
                         (ushort)(sVar46 < sVar44) * sVar44 | (ushort)(sVar46 >= sVar44) * sVar46;
                    auVar145._2_2_ =
                         (ushort)(sVar47 < sVar45) * sVar45 | (ushort)(sVar47 >= sVar45) * sVar47;
                    auVar145._4_2_ =
                         (ushort)(sVar67 < sVar63) * sVar63 | (ushort)(sVar67 >= sVar63) * sVar67;
                    auVar145._6_2_ =
                         (ushort)(sVar70 < sVar64) * sVar64 | (ushort)(sVar70 >= sVar64) * sVar70;
                    auVar145._8_2_ =
                         (ushort)(sVar73 < sVar65) * sVar65 | (ushort)(sVar73 >= sVar65) * sVar73;
                    auVar145._10_2_ =
                         (ushort)(sVar76 < sVar66) * sVar66 | (ushort)(sVar76 >= sVar66) * sVar76;
                    auVar145._12_2_ =
                         (ushort)(sVar79 < sVar68) * sVar68 | (ushort)(sVar79 >= sVar68) * sVar79;
                    auVar145._14_2_ =
                         (ushort)(sVar82 < sVar69) * sVar69 | (ushort)(sVar82 >= sVar69) * sVar82;
                  }
                  auVar93 = paddsw(auVar92,ZEXT416(uVar22 & 0xffff));
                  sVar46 = auVar93._0_2_;
                  auVar58._0_2_ = -(ushort)((short)uVar126 < sVar46);
                  sVar47 = auVar93._2_2_;
                  sVar44 = auVar127._0_2_;
                  auVar58._2_2_ = -(ushort)(sVar44 < sVar47);
                  sVar67 = auVar93._4_2_;
                  sVar45 = auVar127._2_2_;
                  auVar58._4_2_ = -(ushort)(sVar45 < sVar67);
                  sVar70 = auVar93._6_2_;
                  sVar63 = auVar127._4_2_;
                  auVar58._6_2_ = -(ushort)(sVar63 < sVar70);
                  sVar73 = auVar93._8_2_;
                  sVar64 = auVar127._6_2_;
                  auVar58._8_2_ = -(ushort)(sVar64 < sVar73);
                  sVar76 = auVar93._10_2_;
                  sVar65 = auVar127._8_2_;
                  auVar58._10_2_ = -(ushort)(sVar65 < sVar76);
                  sVar79 = auVar93._12_2_;
                  sVar66 = auVar127._10_2_;
                  sVar82 = auVar93._14_2_;
                  auVar58._12_2_ = -(ushort)(sVar66 < sVar79);
                  sVar68 = auVar127._12_2_;
                  auVar58._14_2_ = -(ushort)(sVar68 < sVar82);
                  local_1b8._2_2_ =
                       (ushort)(sVar44 < sVar47) * sVar47 | (ushort)(sVar44 >= sVar47) * sVar44;
                  local_1b8._0_2_ =
                       (ushort)((short)uVar126 < sVar46) * sVar46 |
                       ((short)uVar126 >= sVar46) * uVar126;
                  local_1b8._4_2_ =
                       (ushort)(sVar45 < sVar67) * sVar67 | (ushort)(sVar45 >= sVar67) * sVar45;
                  local_1b8._6_2_ =
                       (ushort)(sVar63 < sVar70) * sVar70 | (ushort)(sVar63 >= sVar70) * sVar63;
                  local_1b8._8_2_ =
                       (ushort)(sVar64 < sVar73) * sVar73 | (ushort)(sVar64 >= sVar73) * sVar64;
                  local_1b8._10_2_ =
                       (ushort)(sVar65 < sVar76) * sVar76 | (ushort)(sVar65 >= sVar76) * sVar65;
                  local_1b8._12_2_ =
                       (ushort)(sVar66 < sVar79) * sVar79 | (ushort)(sVar66 >= sVar79) * sVar66;
                  local_1b8._14_2_ =
                       (ushort)(sVar68 < sVar82) * sVar82 | (ushort)(sVar68 >= sVar82) * sVar68;
                  local_298 = pblendvb(auVar110,local_d8,auVar58);
                  local_2a8 = pblendvb(auVar144,local_e8,auVar58);
                  local_2b8 = pblendvb(auVar113,local_f8,auVar58);
                  lVar30 = 0;
                  for (uVar32 = 0; t = (int32_t)uVar34, uVar42 != uVar32; uVar32 = uVar32 + 1) {
                    auVar17._4_4_ = uVar48;
                    auVar17._0_4_ = uVar48;
                    auVar17._8_4_ = uVar48;
                    auVar17._12_4_ = uVar48;
                    auVar83 = psubsw(local_1b8,auVar17);
                    auVar19._4_4_ = uVar49;
                    auVar19._0_4_ = uVar49;
                    auVar19._8_4_ = uVar49;
                    auVar19._12_4_ = uVar49;
                    auVar104 = psubsw(auVar93,auVar19);
                    sVar46 = auVar83._0_2_;
                    sVar44 = auVar104._0_2_;
                    auVar59._0_2_ = -(ushort)(sVar44 < sVar46);
                    sVar47 = auVar83._2_2_;
                    sVar45 = auVar104._2_2_;
                    auVar59._2_2_ = -(ushort)(sVar45 < sVar47);
                    sVar67 = auVar83._4_2_;
                    sVar63 = auVar104._4_2_;
                    auVar59._4_2_ = -(ushort)(sVar63 < sVar67);
                    sVar70 = auVar83._6_2_;
                    sVar64 = auVar104._6_2_;
                    auVar59._6_2_ = -(ushort)(sVar64 < sVar70);
                    sVar73 = auVar83._8_2_;
                    sVar65 = auVar104._8_2_;
                    auVar59._8_2_ = -(ushort)(sVar65 < sVar73);
                    sVar76 = auVar83._10_2_;
                    sVar66 = auVar104._10_2_;
                    auVar59._10_2_ = -(ushort)(sVar66 < sVar76);
                    sVar79 = auVar83._12_2_;
                    sVar68 = auVar104._12_2_;
                    sVar82 = auVar83._14_2_;
                    auVar59._12_2_ = -(ushort)(sVar68 < sVar79);
                    sVar69 = auVar104._14_2_;
                    auVar59._14_2_ = -(ushort)(sVar69 < sVar82);
                    local_d8 = pblendvb(local_d8,local_298,auVar59);
                    puVar1 = (ushort *)((long)*ptr + lVar30);
                    uVar126 = *puVar1;
                    uVar131 = puVar1[1];
                    uVar133 = puVar1[2];
                    uVar135 = puVar1[3];
                    uVar137 = puVar1[4];
                    uVar139 = puVar1[5];
                    uVar141 = puVar1[6];
                    uVar143 = puVar1[7];
                    local_e8 = pblendvb(local_e8,local_2a8,auVar59);
                    uVar114 = (ushort)(sVar46 < sVar44) * sVar44 |
                              (ushort)(sVar46 >= sVar44) * sVar46;
                    uVar116 = (ushort)(sVar47 < sVar45) * sVar45 |
                              (ushort)(sVar47 >= sVar45) * sVar47;
                    uVar117 = (ushort)(sVar67 < sVar63) * sVar63 |
                              (ushort)(sVar67 >= sVar63) * sVar67;
                    uVar118 = (ushort)(sVar70 < sVar64) * sVar64 |
                              (ushort)(sVar70 >= sVar64) * sVar70;
                    uVar119 = (ushort)(sVar73 < sVar65) * sVar65 |
                              (ushort)(sVar73 >= sVar65) * sVar73;
                    uVar120 = (ushort)(sVar76 < sVar66) * sVar66 |
                              (ushort)(sVar76 >= sVar66) * sVar76;
                    uVar121 = (ushort)(sVar79 < sVar68) * sVar68 |
                              (ushort)(sVar79 >= sVar68) * sVar79;
                    uVar122 = (ushort)(sVar82 < sVar69) * sVar69 |
                              (ushort)(sVar82 >= sVar69) * sVar82;
                    auVar104 = pblendvb(local_f8,local_2b8,auVar59);
                    psVar2 = (short *)((long)*b + lVar30);
                    sVar46 = *psVar2;
                    sVar47 = psVar2[1];
                    sVar67 = psVar2[2];
                    sVar70 = psVar2[3];
                    sVar73 = psVar2[4];
                    sVar76 = psVar2[5];
                    sVar79 = psVar2[6];
                    sVar82 = psVar2[7];
                    uVar89 = (sVar46 < (short)uVar126) * uVar126 |
                             (ushort)(sVar46 >= (short)uVar126) * sVar46;
                    uVar97 = (sVar47 < (short)uVar131) * uVar131 |
                             (ushort)(sVar47 >= (short)uVar131) * sVar47;
                    uVar98 = (sVar67 < (short)uVar133) * uVar133 |
                             (ushort)(sVar67 >= (short)uVar133) * sVar67;
                    uVar99 = (sVar70 < (short)uVar135) * uVar135 |
                             (ushort)(sVar70 >= (short)uVar135) * sVar70;
                    uVar100 = (sVar73 < (short)uVar137) * uVar137 |
                              (ushort)(sVar73 >= (short)uVar137) * sVar73;
                    uVar101 = (sVar76 < (short)uVar139) * uVar139 |
                              (ushort)(sVar76 >= (short)uVar139) * sVar76;
                    uVar102 = (sVar79 < (short)uVar141) * uVar141 |
                              (ushort)(sVar79 >= (short)uVar141) * sVar79;
                    uVar103 = (sVar82 < (short)uVar143) * uVar143 |
                              (ushort)(sVar82 >= (short)uVar143) * sVar82;
                    local_1b8._0_2_ =
                         ((short)uVar89 < (short)uVar114) * uVar114 |
                         ((short)uVar89 >= (short)uVar114) * uVar89;
                    local_1b8._2_2_ =
                         ((short)uVar97 < (short)uVar116) * uVar116 |
                         ((short)uVar97 >= (short)uVar116) * uVar97;
                    local_1b8._4_2_ =
                         ((short)uVar98 < (short)uVar117) * uVar117 |
                         ((short)uVar98 >= (short)uVar117) * uVar98;
                    local_1b8._6_2_ =
                         ((short)uVar99 < (short)uVar118) * uVar118 |
                         ((short)uVar99 >= (short)uVar118) * uVar99;
                    local_1b8._8_2_ =
                         ((short)uVar100 < (short)uVar119) * uVar119 |
                         ((short)uVar100 >= (short)uVar119) * uVar100;
                    local_1b8._10_2_ =
                         ((short)uVar101 < (short)uVar120) * uVar120 |
                         ((short)uVar101 >= (short)uVar120) * uVar101;
                    local_1b8._12_2_ =
                         ((short)uVar102 < (short)uVar121) * uVar121 |
                         ((short)uVar102 >= (short)uVar121) * uVar102;
                    local_1b8._14_2_ =
                         ((short)uVar103 < (short)uVar122) * uVar122 |
                         ((short)uVar103 >= (short)uVar122) * uVar103;
                    auVar86._0_2_ = -(ushort)(uVar126 == local_1b8._0_2_);
                    auVar86._2_2_ = -(ushort)(uVar131 == local_1b8._2_2_);
                    auVar86._4_2_ = -(ushort)(uVar133 == local_1b8._4_2_);
                    auVar86._6_2_ = -(ushort)(uVar135 == local_1b8._6_2_);
                    auVar86._8_2_ = -(ushort)(uVar137 == local_1b8._8_2_);
                    auVar86._10_2_ = -(ushort)(uVar139 == local_1b8._10_2_);
                    auVar86._12_2_ = -(ushort)(uVar141 == local_1b8._12_2_);
                    auVar86._14_2_ = -(ushort)(uVar143 == local_1b8._14_2_);
                    auVar94._0_2_ = -(ushort)((short)uVar114 < (short)uVar89);
                    auVar94._2_2_ = -(ushort)((short)uVar116 < (short)uVar97);
                    auVar94._4_2_ = -(ushort)((short)uVar117 < (short)uVar98);
                    auVar94._6_2_ = -(ushort)((short)uVar118 < (short)uVar99);
                    auVar94._8_2_ = -(ushort)((short)uVar119 < (short)uVar100);
                    auVar94._10_2_ = -(ushort)((short)uVar120 < (short)uVar101);
                    auVar94._12_2_ = -(ushort)((short)uVar121 < (short)uVar102);
                    auVar94._14_2_ = -(ushort)((short)uVar122 < (short)uVar103);
                    auVar83 = pblendvb(local_d8,*(undefined1 (*) [16])((long)*b_00 + lVar30),auVar94
                                      );
                    local_298 = pblendvb(auVar83,*(undefined1 (*) [16])((long)*b_03 + lVar30),
                                         auVar86);
                    auVar83 = pblendvb(local_e8,*(undefined1 (*) [16])((long)*b_01 + lVar30),auVar94
                                      );
                    local_2a8 = pblendvb(auVar83,*(undefined1 (*) [16])((long)*b_04 + lVar30),
                                         auVar86);
                    local_f8 = paddsw(auVar104,_DAT_008a1ba0);
                    auVar83 = pblendvb(local_f8,*(undefined1 (*) [16])((long)*b_02 + lVar30),auVar94
                                      );
                    local_2b8 = pblendvb(auVar83,*(undefined1 (*) [16])((long)*b_05 + lVar30),
                                         auVar86);
                    puVar1 = (ushort *)((long)*ptr + lVar30);
                    *puVar1 = local_1b8._0_2_;
                    puVar1[1] = local_1b8._2_2_;
                    puVar1[2] = local_1b8._4_2_;
                    puVar1[3] = local_1b8._6_2_;
                    puVar1[4] = local_1b8._8_2_;
                    puVar1[5] = local_1b8._10_2_;
                    puVar1[6] = local_1b8._12_2_;
                    puVar1[7] = local_1b8._14_2_;
                    *(undefined1 (*) [16])((long)*b_03 + lVar30) = local_298;
                    *(undefined1 (*) [16])((long)*b_04 + lVar30) = local_2a8;
                    *(undefined1 (*) [16])((long)*b_05 + lVar30) = local_2b8;
                    bVar43 = (short)local_1b8._0_2_ < (short)local_188;
                    uVar131 = (ushort)!bVar43 * (short)local_188;
                    bVar8 = (short)local_1b8._2_2_ < local_188._2_2_;
                    uVar126 = (ushort)!bVar8 * local_188._2_2_;
                    bVar9 = (short)local_1b8._4_2_ < local_188._4_2_;
                    uVar139 = (ushort)!bVar9 * local_188._4_2_;
                    bVar10 = (short)local_1b8._8_2_ < (short)uStack_180;
                    uVar137 = (ushort)!bVar10 * (short)uStack_180;
                    bVar11 = (short)local_1b8._10_2_ < uStack_180._2_2_;
                    uVar135 = (ushort)!bVar11 * uStack_180._2_2_;
                    bVar12 = (short)local_1b8._12_2_ < uStack_180._4_2_;
                    uVar133 = (ushort)!bVar12 * uStack_180._4_2_;
                    local_188 = CONCAT26((ushort)((short)local_1b8._6_2_ < local_188._6_2_) *
                                         local_1b8._6_2_ |
                                         (ushort)((short)local_1b8._6_2_ >= local_188._6_2_) *
                                         local_188._6_2_,
                                         CONCAT24((ushort)bVar9 * local_1b8._4_2_ | uVar139,
                                                  CONCAT22((ushort)bVar8 * local_1b8._2_2_ | uVar126
                                                           ,(ushort)bVar43 * local_1b8._0_2_ |
                                                            uVar131)));
                    uStack_180 = CONCAT26((ushort)((short)local_1b8._14_2_ < uStack_180._6_2_) *
                                          local_1b8._14_2_ |
                                          (ushort)((short)local_1b8._14_2_ >= uStack_180._6_2_) *
                                          uStack_180._6_2_,
                                          CONCAT24((ushort)bVar12 * local_1b8._12_2_ | uVar133,
                                                   CONCAT22((ushort)bVar11 * local_1b8._10_2_ |
                                                            uVar135,(ushort)bVar10 * local_1b8._8_2_
                                                                    | uVar137)));
                    uVar126 = (ushort)((short)local_178._0_2_ < (short)local_1b8._0_2_) *
                              local_1b8._0_2_ |
                              (ushort)((short)local_178._0_2_ >= (short)local_1b8._0_2_) *
                              local_178._0_2_;
                    uVar131 = (ushort)((short)local_178._2_2_ < (short)local_1b8._2_2_) *
                              local_1b8._2_2_ |
                              (ushort)((short)local_178._2_2_ >= (short)local_1b8._2_2_) *
                              local_178._2_2_;
                    uVar133 = (ushort)((short)local_178._4_2_ < (short)local_1b8._4_2_) *
                              local_1b8._4_2_ |
                              (ushort)((short)local_178._4_2_ >= (short)local_1b8._4_2_) *
                              local_178._4_2_;
                    uVar135 = (ushort)((short)local_178._6_2_ < (short)local_1b8._6_2_) *
                              local_1b8._6_2_ |
                              (ushort)((short)local_178._6_2_ >= (short)local_1b8._6_2_) *
                              local_178._6_2_;
                    uVar137 = (ushort)((short)local_178._8_2_ < (short)local_1b8._8_2_) *
                              local_1b8._8_2_ |
                              (ushort)((short)local_178._8_2_ >= (short)local_1b8._8_2_) *
                              local_178._8_2_;
                    uVar139 = (ushort)((short)local_178._10_2_ < (short)local_1b8._10_2_) *
                              local_1b8._10_2_ |
                              (ushort)((short)local_178._10_2_ >= (short)local_1b8._10_2_) *
                              local_178._10_2_;
                    uVar141 = (ushort)((short)local_178._12_2_ < (short)local_1b8._12_2_) *
                              local_1b8._12_2_ |
                              (ushort)((short)local_178._12_2_ >= (short)local_1b8._12_2_) *
                              local_178._12_2_;
                    uVar143 = (ushort)((short)local_178._14_2_ < (short)local_1b8._14_2_) *
                              local_1b8._14_2_ |
                              (ushort)((short)local_178._14_2_ >= (short)local_1b8._14_2_) *
                              local_178._14_2_;
                    sVar46 = local_298._0_2_;
                    uVar89 = (ushort)((short)uVar126 < sVar46) * sVar46 |
                             ((short)uVar126 >= sVar46) * uVar126;
                    sVar46 = local_298._2_2_;
                    uVar97 = (ushort)((short)uVar131 < sVar46) * sVar46 |
                             ((short)uVar131 >= sVar46) * uVar131;
                    sVar46 = local_298._4_2_;
                    uVar98 = (ushort)((short)uVar133 < sVar46) * sVar46 |
                             ((short)uVar133 >= sVar46) * uVar133;
                    sVar46 = local_298._6_2_;
                    uVar99 = (ushort)((short)uVar135 < sVar46) * sVar46 |
                             ((short)uVar135 >= sVar46) * uVar135;
                    sVar46 = local_298._8_2_;
                    uVar100 = (ushort)((short)uVar137 < sVar46) * sVar46 |
                              ((short)uVar137 >= sVar46) * uVar137;
                    sVar46 = local_298._10_2_;
                    uVar101 = (ushort)((short)uVar139 < sVar46) * sVar46 |
                              ((short)uVar139 >= sVar46) * uVar139;
                    sVar46 = local_298._12_2_;
                    uVar102 = (ushort)((short)uVar141 < sVar46) * sVar46 |
                              ((short)uVar141 >= sVar46) * uVar141;
                    sVar46 = local_298._14_2_;
                    uVar103 = (ushort)((short)uVar143 < sVar46) * sVar46 |
                              ((short)uVar143 >= sVar46) * uVar143;
                    sVar46 = local_2b8._0_2_;
                    sVar47 = local_2a8._0_2_;
                    uVar126 = (ushort)(sVar47 < sVar46) * sVar46 |
                              (ushort)(sVar47 >= sVar46) * sVar47;
                    sVar46 = local_2b8._2_2_;
                    sVar47 = local_2a8._2_2_;
                    uVar131 = (ushort)(sVar47 < sVar46) * sVar46 |
                              (ushort)(sVar47 >= sVar46) * sVar47;
                    sVar46 = local_2b8._4_2_;
                    sVar47 = local_2a8._4_2_;
                    uVar133 = (ushort)(sVar47 < sVar46) * sVar46 |
                              (ushort)(sVar47 >= sVar46) * sVar47;
                    sVar46 = local_2b8._6_2_;
                    sVar47 = local_2a8._6_2_;
                    uVar135 = (ushort)(sVar47 < sVar46) * sVar46 |
                              (ushort)(sVar47 >= sVar46) * sVar47;
                    sVar46 = local_2b8._8_2_;
                    sVar47 = local_2a8._8_2_;
                    uVar137 = (ushort)(sVar47 < sVar46) * sVar46 |
                              (ushort)(sVar47 >= sVar46) * sVar47;
                    sVar46 = local_2b8._10_2_;
                    sVar47 = local_2a8._10_2_;
                    uVar139 = (ushort)(sVar47 < sVar46) * sVar46 |
                              (ushort)(sVar47 >= sVar46) * sVar47;
                    sVar46 = local_2b8._12_2_;
                    sVar47 = local_2a8._12_2_;
                    sVar67 = local_2a8._14_2_;
                    uVar141 = (ushort)(sVar47 < sVar46) * sVar46 |
                              (ushort)(sVar47 >= sVar46) * sVar47;
                    sVar46 = local_2b8._14_2_;
                    uVar143 = (ushort)(sVar67 < sVar46) * sVar46 |
                              (ushort)(sVar67 >= sVar46) * sVar67;
                    local_178._2_2_ =
                         ((short)uVar97 < (short)uVar131) * uVar131 |
                         ((short)uVar97 >= (short)uVar131) * uVar97;
                    local_178._0_2_ =
                         ((short)uVar89 < (short)uVar126) * uVar126 |
                         ((short)uVar89 >= (short)uVar126) * uVar89;
                    local_178._4_2_ =
                         ((short)uVar98 < (short)uVar133) * uVar133 |
                         ((short)uVar98 >= (short)uVar133) * uVar98;
                    local_178._6_2_ =
                         ((short)uVar99 < (short)uVar135) * uVar135 |
                         ((short)uVar99 >= (short)uVar135) * uVar99;
                    local_178._8_2_ =
                         ((short)uVar100 < (short)uVar137) * uVar137 |
                         ((short)uVar100 >= (short)uVar137) * uVar100;
                    local_178._10_2_ =
                         ((short)uVar101 < (short)uVar139) * uVar139 |
                         ((short)uVar101 >= (short)uVar139) * uVar101;
                    local_178._12_2_ =
                         ((short)uVar102 < (short)uVar141) * uVar141 |
                         ((short)uVar102 >= (short)uVar141) * uVar102;
                    local_178._14_2_ =
                         ((short)uVar103 < (short)uVar143) * uVar143 |
                         ((short)uVar103 >= (short)uVar143) * uVar103;
                    vH[0] = uVar32 & 0xffffffff;
                    vH[1] = uVar42;
                    arr_store_si128(*((ppVar25->field_4).trace)->trace_del_table,vH,t,s2Len,
                                    (int32_t)palVar38,in_stack_fffffffffffffce8);
                    vH_00[0] = uVar32 & 0xffffffff;
                    vH_00[1] = uVar42;
                    arr_store_si128(*(int **)((long)((ppVar25->field_4).trace)->trace_del_table + 8)
                                    ,vH_00,t,s2Len,(int32_t)palVar38,in_stack_fffffffffffffce8);
                    vH_01[0] = uVar32 & 0xffffffff;
                    vH_01[1] = uVar42;
                    arr_store_si128(*(int **)((long)((ppVar25->field_4).trace)->trace_del_table +
                                             0x10),vH_01,t,s2Len,(int32_t)palVar38,
                                    in_stack_fffffffffffffce8);
                    vH_02[0] = uVar32 & 0xffffffff;
                    vH_02[1] = uVar42;
                    arr_store_si128(*(int **)((long)((ppVar25->field_4).trace)->trace_del_table +
                                             0x18),vH_02,t,s2Len,(int32_t)palVar38,
                                    in_stack_fffffffffffffce8);
                    lVar30 = lVar30 + 0x10;
                    auVar93._2_2_ = uVar116;
                    auVar93._0_2_ = uVar114;
                    auVar93._4_2_ = uVar117;
                    auVar93._6_2_ = uVar118;
                    auVar93._8_2_ = uVar119;
                    auVar93._10_2_ = uVar120;
                    auVar93._12_2_ = uVar121;
                    auVar93._14_2_ = uVar122;
                  }
                  sVar46 = (short)(*palVar26)[0];
                  sVar47 = *(short *)((long)*palVar26 + 2);
                  sVar67 = *(short *)((long)*palVar26 + 4);
                  sVar70 = *(short *)((long)*palVar26 + 6);
                  sVar73 = (short)(*palVar26)[1];
                  sVar76 = *(short *)((long)*palVar26 + 10);
                  sVar79 = *(short *)((long)*palVar26 + 0xc);
                  sVar82 = *(short *)((long)*palVar26 + 0xe);
                  local_98 = auVar111._0_2_;
                  sStack_96 = auVar111._2_2_;
                  sStack_94 = auVar111._4_2_;
                  sStack_92 = auVar111._6_2_;
                  sStack_90 = auVar111._8_2_;
                  sStack_8e = auVar111._10_2_;
                  sStack_8c = auVar111._12_2_;
                  sStack_8a = auVar111._14_2_;
                  auVar60._0_2_ = -(ushort)(local_98 < sVar46);
                  auVar60._2_2_ = -(ushort)(sStack_96 < sVar47);
                  auVar60._4_2_ = -(ushort)(sStack_94 < sVar67);
                  auVar60._6_2_ = -(ushort)(sStack_92 < sVar70);
                  auVar60._8_2_ = -(ushort)(sStack_90 < sVar73);
                  auVar60._10_2_ = -(ushort)(sStack_8e < sVar76);
                  auVar60._12_2_ = -(ushort)(sStack_8c < sVar79);
                  auVar60._14_2_ = -(ushort)(sStack_8a < sVar82);
                  auVar109 = pblendvb(auVar109,(undefined1  [16])b_03[uVar50],auVar60);
                  auVar105 = pblendvb(auVar105,(undefined1  [16])b_04[uVar50],auVar60);
                  auVar95 = pblendvb(auVar95,(undefined1  [16])b_05[uVar50],auVar60);
                  auVar111._0_2_ =
                       (ushort)(local_98 < sVar46) * sVar46 |
                       (ushort)(local_98 >= sVar46) * local_98;
                  auVar111._2_2_ =
                       (ushort)(sStack_96 < sVar47) * sVar47 |
                       (ushort)(sStack_96 >= sVar47) * sStack_96;
                  auVar111._4_2_ =
                       (ushort)(sStack_94 < sVar67) * sVar67 |
                       (ushort)(sStack_94 >= sVar67) * sStack_94;
                  auVar111._6_2_ =
                       (ushort)(sStack_92 < sVar70) * sVar70 |
                       (ushort)(sStack_92 >= sVar70) * sStack_92;
                  auVar111._8_2_ =
                       (ushort)(sStack_90 < sVar73) * sVar73 |
                       (ushort)(sStack_90 >= sVar73) * sStack_90;
                  auVar111._10_2_ =
                       (ushort)(sStack_8e < sVar76) * sVar76 |
                       (ushort)(sStack_8e >= sVar76) * sStack_8e;
                  auVar111._12_2_ =
                       (ushort)(sStack_8c < sVar79) * sVar79 |
                       (ushort)(sStack_8c >= sVar79) * sStack_8c;
                  auVar111._14_2_ =
                       (ushort)(sStack_8a < sVar82) * sVar82 |
                       (ushort)(sStack_8a >= sVar82) * sStack_8a;
                  auVar15._2_2_ = -(ushort)(sStack_1a6 == 6);
                  auVar15._0_2_ = -(ushort)(local_1a8 == 7);
                  auVar15._4_2_ = -(ushort)(local_1a8 == 5);
                  auVar15._6_2_ = -(ushort)(sStack_1a6 == 4);
                  auVar15._8_2_ = -(ushort)(local_1a8 == 3);
                  auVar15._10_2_ = -(ushort)(sStack_1a6 == 2);
                  auVar15._12_2_ = -(ushort)(local_1a8 == 1);
                  auVar15._14_2_ = -(ushort)(sStack_1a6 == 0);
                  auVar60 = auVar60 & auVar15;
                  uVar34 = uVar107;
                  local_268 = auVar113;
                  local_258 = auVar144;
                  local_248 = auVar110;
                  if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar60 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar60 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar60 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar60 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar60 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar60 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar60 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar60 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar60 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar60 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar60 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar60 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar60[0xf] < '\0') {
                    local_314 = t;
                  }
                }
                uVar28 = 0;
                if (s2_end == 0) {
                  sVar46 = 0;
                  sVar47 = 0;
                }
                else {
                  while( true ) {
                    uVar32 = auVar111._0_8_;
                    lVar40 = auVar111._8_8_;
                    uVar107 = auVar109._0_8_;
                    lVar39 = auVar109._8_8_;
                    uVar34 = auVar105._0_8_;
                    lVar37 = auVar105._8_8_;
                    uVar42 = auVar95._0_8_;
                    lVar30 = auVar95._8_8_;
                    if ((int)uVar27 <= (int)uVar28) break;
                    auVar111._0_8_ = uVar32 << 0x10;
                    auVar111._8_8_ = lVar40 << 0x10 | uVar32 >> 0x30;
                    auVar109._0_8_ = uVar107 << 0x10;
                    auVar109._8_8_ = lVar39 << 0x10 | uVar107 >> 0x30;
                    auVar105._0_8_ = uVar34 << 0x10;
                    auVar105._8_8_ = lVar37 << 0x10 | uVar34 >> 0x30;
                    auVar95._0_8_ = uVar42 << 0x10;
                    auVar95._8_8_ = lVar30 << 0x10 | uVar42 >> 0x30;
                    uVar28 = uVar28 + 1;
                  }
                  uVar22 = (uint)auVar111._14_2_;
                  uVar28 = (uint)auVar109._14_2_;
                  sVar46 = auVar105._14_2_;
                  sVar47 = auVar95._14_2_;
                }
                sVar67 = (short)uVar28;
                uVar126 = (ushort)uVar22;
                uVar23 = uVar31;
                if (s1_end != 0) {
                  uVar42 = 0;
                  while( true ) {
                    sVar67 = (short)uVar28;
                    uVar126 = (ushort)uVar22;
                    if ((uVar41 & 0xfffffff) << 3 == (uint)uVar42) break;
                    uVar36 = ((uint)uVar42 & 7) * uVar41 + ((uint)(uVar42 >> 3) & 0x1fffffff);
                    if ((int)uVar36 < (int)uVar3) {
                      uVar131 = *(ushort *)((long)*ptr + uVar42 * 2);
                      uVar20 = (uint)uVar131;
                      if (((short)uVar126 < (short)uVar131) ||
                         (((uVar131 == uVar126 && (local_314 == iVar21)) &&
                          (uVar20 = uVar22, (int)uVar36 < (int)uVar23)))) {
                        uVar22 = uVar20;
                        uVar28 = (uint)*(ushort *)((long)*b_03 + uVar42 * 2);
                        sVar46 = *(short *)((long)*b_04 + uVar42 * 2);
                        sVar47 = *(short *)((long)*b_05 + uVar42 * 2);
                        local_314 = iVar21;
                        uVar23 = uVar36;
                      }
                    }
                    uVar42 = uVar42 + 1;
                  }
                }
                if (s2_end == 0 && s1_end == 0) {
                  alVar106 = *palVar26;
                  alVar96 = b_03[uVar50];
                  alVar87 = b_04[uVar50];
                  alVar61 = b_05[uVar50];
                  iVar24 = 0;
                  while( true ) {
                    uVar107 = alVar106[0];
                    lVar40 = alVar106[1];
                    uVar34 = alVar96[0];
                    lVar39 = alVar96[1];
                    uVar42 = alVar87[0];
                    lVar37 = alVar87[1];
                    uVar50 = alVar61[0];
                    lVar30 = alVar61[1];
                    if ((int)uVar27 <= iVar24) break;
                    alVar106[0] = uVar107 << 0x10;
                    alVar106[1] = lVar40 << 0x10 | uVar107 >> 0x30;
                    alVar96[0] = uVar34 << 0x10;
                    alVar96[1] = lVar39 << 0x10 | uVar34 >> 0x30;
                    alVar87[0] = uVar42 << 0x10;
                    alVar87[1] = lVar37 << 0x10 | uVar42 >> 0x30;
                    alVar61[0] = uVar50 << 0x10;
                    alVar61[1] = lVar30 << 0x10 | uVar50 >> 0x30;
                    iVar24 = iVar24 + 1;
                  }
                  uVar126 = alVar106[1]._6_2_;
                  sVar67 = alVar96[1]._6_2_;
                  sVar46 = alVar87[1]._6_2_;
                  sVar47 = alVar61[1]._6_2_;
                  uVar23 = uVar31;
                  local_314 = iVar21;
                }
                auVar62._0_2_ = -(ushort)((short)local_188 < local_1c8);
                auVar62._2_2_ = -(ushort)(local_188._2_2_ < sStack_1c6);
                auVar62._4_2_ = -(ushort)(local_188._4_2_ < local_1c8);
                auVar62._6_2_ = -(ushort)(local_188._6_2_ < sStack_1c6);
                auVar62._8_2_ = -(ushort)((short)uStack_180 < local_1c8);
                auVar62._10_2_ = -(ushort)(uStack_180._2_2_ < sStack_1c6);
                auVar62._12_2_ = -(ushort)(uStack_180._4_2_ < local_1c8);
                auVar62._14_2_ = -(ushort)(uStack_180._6_2_ < sStack_1c6);
                auVar88._0_2_ = -(ushort)(local_108 < (short)local_178._0_2_);
                auVar88._2_2_ = -(ushort)(sStack_106 < (short)local_178._2_2_);
                auVar88._4_2_ = -(ushort)(local_108 < (short)local_178._4_2_);
                auVar88._6_2_ = -(ushort)(sStack_106 < (short)local_178._6_2_);
                auVar88._8_2_ = -(ushort)(local_108 < (short)local_178._8_2_);
                auVar88._10_2_ = -(ushort)(sStack_106 < (short)local_178._10_2_);
                auVar88._12_2_ = -(ushort)(local_108 < (short)local_178._12_2_);
                auVar88._14_2_ = -(ushort)(sStack_106 < (short)local_178._14_2_);
                auVar88 = auVar88 | auVar62;
                if ((((((((((((((((auVar88 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar88 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar88 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar88 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar88 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar88 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar88 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar88 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar88 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar88 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar88 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar88 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar88[0xf] < '\0') {
                  *(byte *)&ppVar25->flag = (byte)ppVar25->flag | 0x40;
                  uVar126 = 0;
                  sVar67 = 0;
                  sVar46 = 0;
                  sVar47 = 0;
                  local_314 = 0;
                  uVar23 = 0;
                }
                ppVar25->score = (int)(short)uVar126;
                ppVar25->end_query = uVar23;
                ppVar25->end_ref = local_314;
                *(int *)(ppVar25->field_4).extra = (int)sVar67;
                ((ppVar25->field_4).stats)->similar = (int)sVar46;
                ((ppVar25->field_4).stats)->length = (int)sVar47;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar25;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar29 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_table_scan_profile_sse41_128_16",pcVar29);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi16(vH, vMaxH);
            vMaxH = _mm_max_epi16(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
            vMaxM = _mm_slli_si128(vMaxM, 2);
            vMaxS = _mm_slli_si128(vMaxS, 2);
            vMaxL = _mm_slli_si128(vMaxL, 2);
        }
        end_query = s1Len-1;
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        matches = (int16_t) _mm_extract_epi16(vMaxM, 7);
        similar = (int16_t) _mm_extract_epi16(vMaxS, 7);
        length = (int16_t) _mm_extract_epi16(vMaxL, 7);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int16_t *m = (int16_t*)pvHM;
        int16_t *s = (int16_t*)pvHS;
        int16_t *l = (int16_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}